

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O1

void Abc_NtkPrintSharing(Abc_Ntk_t *pNtk)

{
  uint *puVar1;
  Vec_Ptr_t *pVVar2;
  long lVar3;
  Vec_Ptr_t *pVVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  Abc_Obj_t *pObj2;
  Abc_Obj_t *pObj1;
  Abc_Obj_t *local_40;
  Abc_Obj_t *local_38;
  
  puts("Statistics about sharing of logic nodes among the CO pairs.");
  printf("(CO1,CO2)=NumShared : ");
  pVVar2 = pNtk->vCos;
  if (0 < pVVar2->nSize) {
    uVar6 = 0;
    do {
      local_38 = (Abc_Obj_t *)pVVar2->pArray[uVar6];
      pVVar2 = Abc_NtkDfsNodes(pNtk,&local_38,1);
      if (0 < pVVar2->nSize) {
        lVar3 = 0;
        do {
          puVar1 = (uint *)((long)pVVar2->pArray[lVar3] + 0x14);
          *puVar1 = *puVar1 | 0x10;
          lVar3 = lVar3 + 1;
        } while (lVar3 < pVVar2->nSize);
      }
      pVVar4 = pNtk->vCos;
      if (0 < pVVar4->nSize) {
        uVar7 = 0;
        do {
          local_40 = (Abc_Obj_t *)pVVar4->pArray[uVar7];
          if (uVar6 < uVar7) {
            pVVar4 = Abc_NtkDfsNodes(pNtk,&local_40,1);
            if ((long)pVVar4->nSize < 1) {
              uVar5 = 0;
            }
            else {
              lVar3 = 0;
              uVar5 = 0;
              do {
                uVar5 = (ulong)((int)uVar5 +
                               (uint)((*(uint *)((long)pVVar4->pArray[lVar3] + 0x14) >> 4 & 1) != 0)
                               );
                lVar3 = lVar3 + 1;
              } while (pVVar4->nSize != lVar3);
            }
            printf("(%d,%d)=%d ",uVar6 & 0xffffffff,uVar7 & 0xffffffff,uVar5);
            if (pVVar4->pArray != (void **)0x0) {
              free(pVVar4->pArray);
              pVVar4->pArray = (void **)0x0;
            }
            if (pVVar4 != (Vec_Ptr_t *)0x0) {
              free(pVVar4);
            }
          }
          uVar7 = uVar7 + 1;
          pVVar4 = pNtk->vCos;
        } while ((long)uVar7 < (long)pVVar4->nSize);
      }
      if (0 < pVVar2->nSize) {
        lVar3 = 0;
        do {
          puVar1 = (uint *)((long)pVVar2->pArray[lVar3] + 0x14);
          *puVar1 = *puVar1 & 0xffffffef;
          lVar3 = lVar3 + 1;
        } while (lVar3 < pVVar2->nSize);
      }
      if (pVVar2->pArray != (void **)0x0) {
        free(pVVar2->pArray);
        pVVar2->pArray = (void **)0x0;
      }
      if (pVVar2 != (Vec_Ptr_t *)0x0) {
        free(pVVar2);
      }
      uVar6 = uVar6 + 1;
      pVVar2 = pNtk->vCos;
    } while ((long)uVar6 < (long)pVVar2->nSize);
  }
  putchar(10);
  return;
}

Assistant:

void Abc_NtkPrintSharing( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes1, * vNodes2;
    Abc_Obj_t * pObj1, * pObj2, * pNode1, * pNode2;
    int i, k, m, n, Counter;

    // print the template
    printf( "Statistics about sharing of logic nodes among the CO pairs.\n" );
    printf( "(CO1,CO2)=NumShared : " );
    // go though the CO pairs
    Abc_NtkForEachCo( pNtk, pObj1, i )
    {
        vNodes1 = Abc_NtkDfsNodes( pNtk, &pObj1, 1 );
        // mark the nodes
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes1, pNode1, m )
            pNode1->fMarkA = 1;
        // go through the second COs
        Abc_NtkForEachCo( pNtk, pObj2, k )
        {
            if ( i >= k )
                continue;
            vNodes2 = Abc_NtkDfsNodes( pNtk, &pObj2, 1 );
            // count the number of marked
            Counter = 0;
            Vec_PtrForEachEntry( Abc_Obj_t *, vNodes2, pNode2, n )
                Counter += pNode2->fMarkA;
            // print
            printf( "(%d,%d)=%d ", i, k, Counter );
            Vec_PtrFree( vNodes2 );
        }
        // unmark the nodes
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes1, pNode1, m )
            pNode1->fMarkA = 0;
        Vec_PtrFree( vNodes1 );
    }
    printf( "\n" );
}